

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

void lest::report(ostream *os,message *e,text *test)

{
  pointer pcVar1;
  long lVar2;
  ostream *poVar3;
  char *pcVar4;
  allocator local_119;
  char *local_118;
  long local_110;
  char local_108 [8];
  undefined8 uStack_100;
  long *local_f8;
  long local_f0;
  undefined1 local_e8;
  uint7 uStack_e7;
  undefined8 uStack_e0;
  long *local_d8;
  undefined8 local_d0;
  long local_c8;
  undefined8 uStack_c0;
  char *local_b8;
  long local_b0;
  char local_a8 [8];
  undefined8 uStack_a0;
  comment local_98;
  long *local_78;
  long local_70;
  long local_68;
  undefined8 uStack_60;
  char *local_58;
  long local_50;
  char local_48 [16];
  int local_38;
  
  pcVar1 = (e->where).file._M_dataplus._M_p;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + (e->where).file._M_string_length);
  local_38 = (e->where).line;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,local_58,local_50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
  pcVar1 = (e->kind)._M_dataplus._M_p;
  local_118 = local_108;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,pcVar1,pcVar1 + (e->kind)._M_string_length);
  lVar2 = local_110;
  if (local_118 == local_108) {
    uStack_a0 = uStack_100;
    local_118 = local_a8;
  }
  local_b0 = local_110;
  local_110 = 0;
  local_108[0] = '\0';
  local_b8 = local_118;
  local_118 = local_108;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_b8,lVar2);
  local_98.info._M_dataplus._M_p = (pointer)&local_98.info.field_2;
  pcVar1 = (e->note).info._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar1,pcVar1 + (e->note).info._M_string_length);
  poVar3 = operator<<(poVar3,&local_98);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(test->_M_dataplus)._M_p,test->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
  pcVar4 = (char *)(**(code **)(*(long *)e + 0x10))(e);
  std::__cxx11::string::string((string *)&local_f8,pcVar4,&local_119);
  local_70 = local_f0;
  if (local_f8 == (long *)&local_e8) {
    uStack_c0 = uStack_e0;
    local_f8 = &local_c8;
  }
  local_f0 = 0;
  local_e8 = 0;
  if (local_f8 == &local_c8) {
    uStack_60 = uStack_c0;
    local_f8 = &local_68;
  }
  local_d0 = 0;
  local_c8 = (ulong)uStack_e7 << 8;
  local_78 = local_f8;
  local_f8 = (long *)&local_e8;
  local_d8 = &local_c8;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_78,local_70);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_f8 != (long *)&local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.info._M_dataplus._M_p != &local_98.info.field_2) {
    operator_delete(local_98.info._M_dataplus._M_p);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8);
  }
  if (local_118 != local_108) {
    operator_delete(local_118);
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  return;
}

Assistant:

inline void report( std::ostream & os, message const & e, text test )
{
    os << e.where << ": " << colourise( e.kind ) << e.note << ": " << test << ": " << colourise( e.what() ) << std::endl;
}